

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O3

void __thiscall higan::EventLoopThread::EventLoopThread(EventLoopThread *this,string *name)

{
  pointer pcVar1;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  EventLoop::EventLoop(&this->loop_);
  local_50._8_8_ = 0;
  local_50._M_unused._M_object = operator_new(0x18);
  *(code **)local_50._M_unused._0_8_ = EventLoop::Loop;
  *(undefined8 *)((long)local_50._M_unused._0_8_ + 8) = 0;
  *(EventLoop **)((long)local_50._M_unused._0_8_ + 0x10) = &this->loop_;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(higan::EventLoop::*(higan::EventLoop_*))()>_>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(),_std::_Bind<void_(higan::EventLoop::*(higan::EventLoop_*))()>_>
             ::_M_manager;
  Thread::Thread(&this->thread_,&this->name_,(ThreadFunc *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  Thread::Start(&this->thread_);
  return;
}

Assistant:

EventLoopThread::EventLoopThread(const std::string& name):
		name_(name),
		loop_(),
		thread_(name_, std::bind(&EventLoop::Loop, &loop_))
{
	thread_.Start();
}